

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::MaybeNonFinite<float>(AsciiParser *this,float *out)

{
  bool bVar1;
  reference pvVar2;
  float fVar3;
  bool ok;
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> buf;
  uint64_t loc;
  float *out_local;
  AsciiParser *this_local;
  
  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = CurrLoc(this);
  ::std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_40,4,(allocator_type *)&ok);
  ::std::allocator<char>::~allocator((allocator<char> *)&ok);
  bVar1 = CharN(this,3,(vector<char,_std::allocator<char>_> *)local_40);
  if (bVar1) {
    SeekTo(this,buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_40,0);
    if (((*pvVar2 == 'i') &&
        (pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                            ((vector<char,_std::allocator<char>_> *)local_40,1), *pvVar2 == 'n')) &&
       (pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)local_40,2), *pvVar2 == 'f')) {
      fVar3 = ::std::numeric_limits<float>::infinity();
      *out = fVar3;
      this_local._7_1_ = true;
    }
    else {
      pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_40,0);
      if (((*pvVar2 == 'n') &&
          (pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                              ((vector<char,_std::allocator<char>_> *)local_40,1), *pvVar2 == 'a'))
         && (pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                                ((vector<char,_std::allocator<char>_> *)local_40,2), *pvVar2 == 'n')
         ) {
        fVar3 = ::std::numeric_limits<float>::quiet_NaN();
        *out = fVar3;
        this_local._7_1_ = true;
      }
      else {
        bVar1 = CharN(this,4,(vector<char,_std::allocator<char>_> *)local_40);
        SeekTo(this,buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
        if (((bVar1) &&
            (pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                                ((vector<char,_std::allocator<char>_> *)local_40,0), *pvVar2 == '-')
            ) && ((pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                                      ((vector<char,_std::allocator<char>_> *)local_40,1),
                  *pvVar2 == 'i' &&
                  ((pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                                       ((vector<char,_std::allocator<char>_> *)local_40,2),
                   *pvVar2 == 'n' &&
                   (pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                                       ((vector<char,_std::allocator<char>_> *)local_40,3),
                   *pvVar2 == 'f')))))) {
          fVar3 = ::std::numeric_limits<float>::infinity();
          *out = -fVar3;
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_40)
  ;
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::MaybeNonFinite(T *out) {
  auto loc = CurrLoc();

  // "-inf", "inf" or "nan"
  std::vector<char> buf(4);
  if (!CharN(3, &buf)) {
    return false;
  }
  SeekTo(loc);

  if ((buf[0] == 'i') && (buf[1] == 'n') && (buf[2] == 'f')) {
    (*out) = std::numeric_limits<T>::infinity();
    return true;
  }

  if ((buf[0] == 'n') && (buf[1] == 'a') && (buf[2] == 'n')) {
    (*out) = std::numeric_limits<T>::quiet_NaN();
    return true;
  }

  bool ok = CharN(4, &buf);
  SeekTo(loc);

  if (ok) {
    if ((buf[0] == '-') && (buf[1] == 'i') && (buf[2] == 'n') &&
        (buf[3] == 'f')) {
      (*out) = -std::numeric_limits<T>::infinity();
      return true;
    }

    // NOTE: support "-nan"?
  }

  return false;
}